

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_ersatz_socketpair_(int family,int type,int protocol,int *fd)

{
  int __fd;
  int iVar1;
  int __fd_00;
  int iVar2;
  int iVar3;
  int *piVar4;
  socklen_t size;
  sockaddr_in connect_addr;
  sockaddr local_38;
  
  if (family - 3U < 0xfffffffe || protocol != 0) {
    piVar4 = __errno_location();
    *piVar4 = 0x61;
    return -1;
  }
  if (fd == (int *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return -1;
  }
  __fd = socket(2,type,0);
  if (__fd < 0) {
    return -1;
  }
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_38.sa_family = 2;
  local_38.sa_data[0] = '\0';
  local_38.sa_data[1] = '\0';
  local_38.sa_data[2] = '\x7f';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\x01';
  iVar1 = bind(__fd,&local_38,0x10);
  iVar2 = -1;
  __fd_00 = iVar2;
  if (((iVar1 != -1) && (iVar1 = listen(__fd,1), iVar1 != -1)) &&
     (__fd_00 = socket(2,type,0), -1 < __fd_00)) {
    connect_addr.sin_family = 0;
    connect_addr.sin_port = 0;
    connect_addr.sin_addr.s_addr = 0;
    connect_addr.sin_zero[0] = '\0';
    connect_addr.sin_zero[1] = '\0';
    connect_addr.sin_zero[2] = '\0';
    connect_addr.sin_zero[3] = '\0';
    connect_addr.sin_zero[4] = '\0';
    connect_addr.sin_zero[5] = '\0';
    connect_addr.sin_zero[6] = '\0';
    connect_addr.sin_zero[7] = '\0';
    size = 0x10;
    iVar1 = getsockname(__fd,(sockaddr *)&connect_addr,&size);
    if (iVar1 != -1) {
      iVar1 = 0x67;
      if (size != 0x10) {
        iVar2 = -1;
        goto LAB_001af107;
      }
      iVar2 = connect(__fd_00,(sockaddr *)&connect_addr,0x10);
      if (iVar2 == -1) {
        iVar2 = -1;
      }
      else {
        size = 0x10;
        iVar2 = accept(__fd,&local_38,&size);
        if (-1 < iVar2) {
          if (size != 0x10) goto LAB_001af107;
          iVar3 = getsockname(__fd_00,(sockaddr *)&connect_addr,&size);
          if (iVar3 != -1) {
            if (size == 0x10) {
              if (local_38.sa_family == connect_addr.sin_family) {
                if (local_38.sa_data._2_4_ == connect_addr.sin_addr.s_addr) {
                  if (local_38.sa_data._0_2_ == connect_addr.sin_port) {
                    close(__fd);
                    *fd = __fd_00;
                    fd[1] = iVar2;
                    return 0;
                  }
                }
              }
            }
            goto LAB_001af107;
          }
        }
      }
    }
  }
  piVar4 = __errno_location();
  iVar1 = *piVar4;
LAB_001af107:
  close(__fd);
  if (__fd_00 != -1) {
    close(__fd_00);
  }
  if (iVar2 != -1) {
    close(iVar2);
  }
  piVar4 = __errno_location();
  *piVar4 = iVar1;
  return -1;
}

Assistant:

int
evutil_ersatz_socketpair_(int family, int type, int protocol,
    evutil_socket_t fd[2])
{
	/* This code is originally from Tor.  Used with permission. */

	/* This socketpair does not work when localhost is down. So
	 * it's really not the same thing at all. But it's close enough
	 * for now, and really, when localhost is down sometimes, we
	 * have other problems too.
	 */
#ifdef _WIN32
#define ERR(e) WSA##e
#else
#define ERR(e) e
#endif
	evutil_socket_t listener = -1;
	evutil_socket_t connector = -1;
	evutil_socket_t acceptor = -1;
	struct sockaddr_in listen_addr;
	struct sockaddr_in connect_addr;
	ev_socklen_t size;
	int saved_errno = -1;
	int family_test;
	
	family_test = family != AF_INET;
#ifdef AF_UNIX
	family_test = family_test && (family != AF_UNIX);
#endif
	if (protocol || family_test) {
		EVUTIL_SET_SOCKET_ERROR(ERR(EAFNOSUPPORT));
		return -1;
	}
	
	if (!fd) {
		EVUTIL_SET_SOCKET_ERROR(ERR(EINVAL));
		return -1;
	}

	listener = socket(AF_INET, type, 0);
	if (listener < 0)
		return -1;
	memset(&listen_addr, 0, sizeof(listen_addr));
	listen_addr.sin_family = AF_INET;
	listen_addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	listen_addr.sin_port = 0;	/* kernel chooses port.	 */
	if (bind(listener, (struct sockaddr *) &listen_addr, sizeof (listen_addr))
		== -1)
		goto tidy_up_and_fail;
	if (listen(listener, 1) == -1)
		goto tidy_up_and_fail;

	connector = socket(AF_INET, type, 0);
	if (connector < 0)
		goto tidy_up_and_fail;

	memset(&connect_addr, 0, sizeof(connect_addr));

	/* We want to find out the port number to connect to.  */
	size = sizeof(connect_addr);
	if (getsockname(listener, (struct sockaddr *) &connect_addr, &size) == -1)
		goto tidy_up_and_fail;
	if (size != sizeof (connect_addr))
		goto abort_tidy_up_and_fail;
	if (connect(connector, (struct sockaddr *) &connect_addr,
				sizeof(connect_addr)) == -1)
		goto tidy_up_and_fail;

	size = sizeof(listen_addr);
	acceptor = accept(listener, (struct sockaddr *) &listen_addr, &size);
	if (acceptor < 0)
		goto tidy_up_and_fail;
	if (size != sizeof(listen_addr))
		goto abort_tidy_up_and_fail;
	/* Now check we are talking to ourself by matching port and host on the
	   two sockets.	 */
	if (getsockname(connector, (struct sockaddr *) &connect_addr, &size) == -1)
		goto tidy_up_and_fail;
	if (size != sizeof (connect_addr)
		|| listen_addr.sin_family != connect_addr.sin_family
		|| listen_addr.sin_addr.s_addr != connect_addr.sin_addr.s_addr
		|| listen_addr.sin_port != connect_addr.sin_port)
		goto abort_tidy_up_and_fail;
	evutil_closesocket(listener);
	fd[0] = connector;
	fd[1] = acceptor;

	return 0;

 abort_tidy_up_and_fail:
	saved_errno = ERR(ECONNABORTED);
 tidy_up_and_fail:
	if (saved_errno < 0)
		saved_errno = EVUTIL_SOCKET_ERROR();
	if (listener != -1)
		evutil_closesocket(listener);
	if (connector != -1)
		evutil_closesocket(connector);
	if (acceptor != -1)
		evutil_closesocket(acceptor);

	EVUTIL_SET_SOCKET_ERROR(saved_errno);
	return -1;
#undef ERR
}